

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *this,dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                        *ht,size_type min_buckets_wanted)

{
  undefined8 uVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  size_type sVar11;
  float fVar12;
  
  iVar8 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          super_Hasher.id_;
  iVar9 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          super_Hasher.num_hashes_;
  uVar1 = *(undefined8 *)
           &(ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_compares_;
  sVar11 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           enlarge_threshold_;
  sVar2 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar12 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           shrink_factor_;
  bVar3 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          consider_shrink_;
  bVar4 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_empty_
  ;
  bVar5 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          use_deleted_;
  uVar6 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.field_0x2b
  ;
  uVar7 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.enlarge_factor_
       = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
         enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
       fVar12;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.consider_shrink_
       = bVar3;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_empty_ =
       bVar4;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_deleted_ =
       bVar5;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.field_0x2b =
       uVar6;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.num_ht_copies_ =
       uVar7;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = sVar11;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = sVar2;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.id_
       = iVar8;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar9;
  *(undefined8 *)
   &(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
    num_compares_ = uVar1;
  iVar8 = (ht->key_info).super_Hasher.num_hashes_;
  uVar1 = *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_;
  (this->key_info).super_Hasher.id_ = (ht->key_info).super_Hasher.id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar8;
  *(undefined8 *)&(this->key_info).super_Hasher.num_compares_ = uVar1;
  (this->key_info).empty_key = (ht->key_info).empty_key;
  this->table = (pointer)0x0;
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = 0;
  if ((ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_empty_ !=
      false) {
    fVar12 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
             enlarge_factor_ * 0.0;
    uVar10 = (ulong)fVar12;
    (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar12 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
    fVar12 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
             shrink_factor_ * 0.0;
    uVar10 = (ulong)fVar12;
    (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar12 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
    (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = false;
    dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>>
              ((dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                *)this,ht,min_buckets_wanted);
    return;
  }
  sVar11 = sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::
           min_buckets((sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *)this,
                       ht->num_elements - ht->num_deleted,min_buckets_wanted);
  this->num_buckets = sVar11;
  fVar12 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           enlarge_factor_ * (float)sVar11;
  uVar10 = (ulong)fVar12;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar12 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
  fVar12 = (float)sVar11 *
           (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           shrink_factor_;
  uVar10 = (ulong)fVar12;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar12 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.consider_shrink_
       = false;
  return;
}

Assistant:

dense_hashtable(dense_hashtable&& ht,
                  size_type min_buckets_wanted)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(std::move(ht.val_info)),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_or_move_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(std::move(ht), min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }